

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

Channel * __thiscall
ear::Layout::channelWithName(Channel *__return_storage_ptr__,Layout *this,string *name)

{
  const_iterator __first;
  const_iterator __last;
  reference pCVar1;
  __normal_iterator<const_ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
  local_28;
  __normal_iterator<const_ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
  it;
  string *name_local;
  Layout *this_local;
  
  it._M_current = (Channel *)name;
  __first = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::begin(&this->_channels);
  __last = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::end(&this->_channels);
  local_28 = std::
             find_if<__gnu_cxx::__normal_iterator<ear::Channel_const*,std::vector<ear::Channel,std::allocator<ear::Channel>>>,ear::Layout::channelWithName(std::__cxx11::string_const&)const::__0>
                       (__first._M_current,__last._M_current,it._M_current);
  pCVar1 = __gnu_cxx::
           __normal_iterator<const_ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
           ::operator*(&local_28);
  Channel::Channel(__return_storage_ptr__,pCVar1);
  return __return_storage_ptr__;
}

Assistant:

Channel Layout::channelWithName(const std::string& name) const {
    auto it = std::find_if(
        _channels.begin(), _channels.end(),
        [&name](const Channel c) -> bool { return c.name() == name; });
    return *it;
  }